

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGShowValidError
               (xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGValidErr err,xmlNodePtr node,xmlNodePtr child,
               xmlChar *arg1,xmlChar *arg2)

{
  xmlChar *msg_00;
  xmlNodePtr local_50;
  xmlChar *msg;
  xmlChar *arg2_local;
  xmlChar *arg1_local;
  xmlNodePtr child_local;
  xmlNodePtr node_local;
  xmlRelaxNGValidErr err_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if (((ctxt->flags & 8U) == 0) &&
     (msg_00 = xmlRelaxNGGetErrorString(err,arg1,arg2), msg_00 != (xmlChar *)0x0)) {
    if (ctxt->errNo == 0) {
      ctxt->errNo = err;
    }
    local_50 = child;
    if (child == (xmlNodePtr)0x0) {
      local_50 = node;
    }
    xmlRngVErr(ctxt,local_50,err,(char *)msg_00,arg1,arg2);
    (*xmlFree)(msg_00);
  }
  return;
}

Assistant:

static void
xmlRelaxNGShowValidError(xmlRelaxNGValidCtxtPtr ctxt,
                         xmlRelaxNGValidErr err, xmlNodePtr node,
                         xmlNodePtr child, const xmlChar * arg1,
                         const xmlChar * arg2)
{
    xmlChar *msg;

    if (ctxt->flags & FLAGS_NOERROR)
        return;

    msg = xmlRelaxNGGetErrorString(err, arg1, arg2);
    if (msg == NULL)
        return;

    if (ctxt->errNo == XML_RELAXNG_OK)
        ctxt->errNo = err;
    xmlRngVErr(ctxt, (child == NULL ? node : child), err,
               (const char *) msg, arg1, arg2);
    xmlFree(msg);
}